

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  uint16_t *__dest;
  uint16_t *puVar1;
  uchar *puVar2;
  uint16_t *puVar3;
  short sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  wchar_t wVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  wchar_t wVar13;
  uint uVar14;
  ulong uVar15;
  htree_t *phVar16;
  uint uVar17;
  int iVar18;
  uint16_t uVar19;
  long lVar20;
  ushort uVar21;
  int iVar22;
  ulong uVar23;
  uint16_t *__src;
  wchar_t wVar24;
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint auStack_c8 [20];
  uint auStack_78 [18];
  
  uVar8 = 0x8000;
  uVar15 = 0;
  uVar23 = 0;
  uVar17 = 0;
  do {
    auStack_c8[uVar15 + 1] = uVar17;
    auStack_78[uVar15 + 1] = uVar8;
    lVar10 = uVar15 + 1;
    uVar17 = hf->freq[lVar10] * uVar8 + uVar17;
    uVar15 = uVar15 + 1;
    if (hf->freq[lVar10] != L'\0') {
      uVar23 = uVar15 & 0xffffffff;
    }
    uVar8 = uVar8 >> 1;
  } while (uVar15 != 0x10);
  wVar9 = L'\0';
  if ((uVar17 == 0x10000) && (wVar24 = (wchar_t)uVar23, wVar24 <= hf->tbl_bits)) {
    hf->max_bits = wVar24;
    if ((wVar24 < L'\x10') && (L'\0' < wVar24)) {
      bVar12 = 0x10 - (char)uVar23;
      uVar15 = 1;
      do {
        auStack_c8[uVar15] = (int)auStack_c8[uVar15] >> (bVar12 & 0x1f);
        auStack_78[uVar15] = (int)auStack_78[uVar15] >> (bVar12 & 0x1f);
        uVar15 = uVar15 + 1;
      } while ((uint)(wVar24 + L'\x01') != uVar15);
    }
    wVar9 = L'\0';
    if (L'\n' < wVar24) {
      wVar9 = wVar24 + L'\xfffffff6';
      lVar10 = 1;
      do {
        auStack_c8[lVar10] = (int)auStack_c8[lVar10] >> ((byte)wVar9 & 0x1f);
        auStack_78[lVar10] = (int)auStack_78[lVar10] >> ((byte)wVar9 & 0x1f);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0xb);
      uVar8 = hf->freq[10] * auStack_78[10] + auStack_c8[10];
      if (uVar8 < 0x400) {
        uVar15 = (ulong)(uVar8 * 2);
        memset((void *)((long)hf->tbl + uVar15),0,0x800 - uVar15);
      }
    }
    hf->shift_bits = wVar9;
    puVar2 = hf->bitlen;
    puVar3 = hf->tbl;
    wVar24 = hf->len_avail;
    lVar10 = (long)wVar24;
    hf->tree_used = L'\0';
    if (0 < lVar10) {
      uVar8 = 1 << ((byte)wVar9 - 1 & 0x1f);
      lVar20 = 0;
      do {
        bVar12 = puVar2[lVar20];
        if (bVar12 == 0) {
LAB_0014ca27:
          iVar18 = 0xf;
        }
        else {
          uVar23 = (ulong)((uint)bVar12 * 4);
          uVar17 = *(uint *)((long)auStack_c8 + uVar23);
          uVar14 = *(uint *)((long)auStack_78 + uVar23);
          uVar15 = (ulong)uVar14;
          *(uint *)((long)auStack_c8 + uVar23) = uVar14 + uVar17;
          uVar19 = (uint16_t)lVar20;
          if (bVar12 < 0xb) {
            iVar18 = 1;
            if (0x400 < (int)(uVar14 + uVar17)) goto LAB_0014ca2c;
            __dest = puVar3 + (int)uVar17;
            if ((int)uVar14 < 8) {
              if (1 < (int)uVar14) {
                lVar11 = uVar15 + 2;
                do {
                  __dest[lVar11 + -3] = uVar19;
                  __dest[lVar11 + -4] = uVar19;
                  lVar11 = lVar11 + -2;
                  uVar14 = (int)uVar15 - 2;
                  uVar15 = (ulong)uVar14;
                } while (3 < lVar11);
              }
              if (uVar14 != 0) {
                __dest[(long)(int)uVar14 + -1] = uVar19;
              }
            }
            else {
              uVar15 = (ulong)(uVar14 - 8);
              __src = __dest + uVar15;
              *__src = uVar19;
              __src[1] = uVar19;
              __src[2] = uVar19;
              __src[3] = uVar19;
              __src[4] = uVar19;
              __src[5] = uVar19;
              __src[6] = uVar19;
              __src[7] = uVar19;
              if (0xf < (int)uVar14) {
                uVar15 = (ulong)(uVar14 - 0x10);
                puVar1 = __dest + uVar15;
                *puVar1 = *__src;
                puVar1[1] = __src[1];
                puVar1[2] = __src[2];
                puVar1[3] = __src[3];
                puVar1[4] = __src[4];
                puVar1[5] = __src[5];
                puVar1[6] = __src[6];
                puVar1[7] = __src[7];
                __src = puVar1;
                if (0x1f < (int)uVar14) {
                  lVar11 = uVar15 + 0x10;
                  do {
                    uVar5 = *(undefined8 *)puVar1;
                    uVar6 = *(undefined8 *)(puVar1 + 4);
                    uVar7 = *(undefined8 *)(puVar1 + 0xc);
                    *(undefined8 *)(__dest + lVar11 + -0x18) = *(undefined8 *)(puVar1 + 8);
                    *(undefined8 *)(__dest + lVar11 + -0x18 + 4) = uVar7;
                    *(undefined8 *)(__dest + lVar11 + -0x20) = uVar5;
                    *(undefined8 *)(__dest + lVar11 + -0x20 + 4) = uVar6;
                    lVar11 = lVar11 + -0x10;
                  } while (0x1f < lVar11);
                  uVar15 = (ulong)((int)lVar11 - 0x10);
                }
              }
              if ((int)uVar15 != 0) {
                memcpy(__dest,__src,uVar15 * 2);
              }
            }
            goto LAB_0014ca27;
          }
          iVar22 = (int)uVar17 >> ((byte)wVar9 & 0x1f);
          sVar4 = (short)wVar24;
          if (puVar3[iVar22] == 0) {
            wVar13 = hf->tree_used;
            puVar3[iVar22] = (short)wVar13 + sVar4;
            hf->tree_used = wVar13 + L'\x01';
            iVar18 = 1;
            if (wVar13 < hf->tree_avail) {
              phVar16 = hf->tree + wVar13;
              phVar16->left = 0;
              phVar16->right = 0;
              goto LAB_0014c943;
            }
          }
          else {
            iVar18 = 1;
            wVar13 = (wchar_t)puVar3[iVar22];
            if ((wVar24 <= wVar13) && (wVar13 < hf->tree_used + wVar24)) {
              phVar16 = hf->tree + (wVar13 - wVar24);
LAB_0014c943:
              if (bVar12 == 0xb) {
                uVar21 = (ushort)uVar8;
              }
              else {
                iVar18 = bVar12 - 10;
                uVar14 = uVar8;
                do {
                  if ((uVar14 & 0xffff & uVar17) == 0) {
                    uVar21 = phVar16->right;
                    if (wVar24 <= (int)(uint)uVar21) goto LAB_0014c9df;
                    wVar13 = hf->tree_used;
                    phVar16->right = (short)wVar13 + sVar4;
LAB_0014c9be:
                    hf->tree_used = wVar13 + L'\x01';
                    if (hf->tree_avail <= wVar13) {
                      iVar18 = 1;
                      goto LAB_0014ca2c;
                    }
                    phVar16 = hf->tree + wVar13;
                    phVar16->left = 0;
                    phVar16->right = 0;
                  }
                  else {
                    uVar21 = phVar16->left;
                    if ((int)(uint)uVar21 < wVar24) {
                      wVar13 = hf->tree_used;
                      phVar16->left = (short)wVar13 + sVar4;
                      goto LAB_0014c9be;
                    }
LAB_0014c9df:
                    phVar16 = hf->tree + ((ulong)uVar21 - lVar10);
                  }
                  uVar14 = (uVar14 & 0xffff) >> 1;
                  uVar21 = (ushort)uVar14;
                  iVar18 = iVar18 + -1;
                } while (1 < iVar18);
              }
              if (((ushort)uVar17 & uVar21) == 0) {
                iVar18 = 1;
                if (phVar16->right == 0) {
                  phVar16->right = uVar19;
                  goto LAB_0014ca53;
                }
              }
              else {
                iVar18 = 1;
                if (phVar16->left == 0) {
                  phVar16->left = uVar19;
LAB_0014ca53:
                  iVar18 = 0;
                }
              }
            }
          }
        }
LAB_0014ca2c:
        if ((iVar18 != 0xf) && (iVar18 != 0)) {
          return L'\0';
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != lVar10);
    }
    wVar9 = L'\x01';
  }
  return wVar9;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		unsigned htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			if (cnt > 7) {
				uint16_t *pc;

				cnt -= 8;
				pc = &p[cnt];
				pc[0] = (uint16_t)i;
				pc[1] = (uint16_t)i;
				pc[2] = (uint16_t)i;
				pc[3] = (uint16_t)i;
				pc[4] = (uint16_t)i;
				pc[5] = (uint16_t)i;
				pc[6] = (uint16_t)i;
				pc[7] = (uint16_t)i;
				if (cnt > 7) {
					cnt -= 8;
					memcpy(&p[cnt], pc,
						8 * sizeof(uint16_t));
					pc = &p[cnt];
					while (cnt > 15) {
						cnt -= 16;
						memcpy(&p[cnt], pc,
							16 * sizeof(uint16_t));
					}
				}
				if (cnt)
					memcpy(p, pc, cnt * sizeof(uint16_t));
			} else {
				while (cnt > 1) {
					p[--cnt] = (uint16_t)i;
					p[--cnt] = (uint16_t)i;
				}
				if (cnt)
					p[--cnt] = (uint16_t)i;
			}
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}